

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O0

SMF * SMF_NewFromFile(char *path,LPStatus *status)

{
  _Bool _Var1;
  FILE *__stream;
  SMF *smf;
  FILE *f;
  LPStatus *status_local;
  char *path_local;
  
  __stream = fopen(path,"rb");
  if (__stream == (FILE *)0x0) {
    *status = LUNAPURPURA_CANTOPENFILE;
    path_local = (char *)0x0;
  }
  else {
    _Var1 = ValidateMagicF((FILE *)__stream,SMF_MAGIC,4);
    if (_Var1) {
      path_local = (char *)malloc(8);
      fclose(__stream);
      *status = LUNAPURPURA_OK;
    }
    else {
      *status = LUNAPURPURA_BADMAGIC;
      path_local = (char *)0x0;
    }
  }
  return (SMF *)path_local;
}

Assistant:

SMF *
SMF_NewFromFile(const char *path, LPStatus *status)
{
	FILE *f = fopen(path, "rb");

	if (!f) {
		*status = LUNAPURPURA_CANTOPENFILE;
		return NULL;
	}

	if (!ValidateMagicF(f, SMF_MAGIC, SMF_MAGIC_LEN)) {
		*status = LUNAPURPURA_BADMAGIC;
		return NULL;
	}

	SMF *smf = malloc(sizeof(SMF)); /* XXX error check */

	fclose(f);

	*status = LUNAPURPURA_OK;
	return smf;
}